

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uscript.cpp
# Opt level: O2

int32_t getCodesFromLocale(char *locale,UScriptCode *scripts,int32_t capacity,UErrorCode *err)

{
  int iVar1;
  int32_t iVar2;
  UScriptCode UVar3;
  UScriptCode UVar4;
  UScriptCode *src;
  UErrorCode internalErrorCode;
  char lang [8];
  char script [8];
  
  internalErrorCode = U_ZERO_ERROR;
  if (U_ZERO_ERROR < *err) {
    return 0;
  }
  uloc_getLanguage_63(locale,lang,8,&internalErrorCode);
  if (internalErrorCode == U_STRING_NOT_TERMINATED_WARNING || U_ZERO_ERROR < internalErrorCode) {
    return 0;
  }
  iVar1 = bcmp(lang,"ja",3);
  if (iVar1 == 0) {
    src = JAPANESE;
    iVar2 = 3;
  }
  else {
    iVar1 = bcmp(lang,"ko",3);
    if (iVar1 == 0) {
      src = KOREAN;
    }
    else {
      iVar2 = uloc_getScript_63(locale,script,8,&internalErrorCode);
      if (internalErrorCode == U_STRING_NOT_TERMINATED_WARNING || U_ZERO_ERROR < internalErrorCode)
      {
        return 0;
      }
      iVar1 = bcmp(lang,"zh",3);
      if ((iVar1 != 0) || (iVar1 = bcmp(script,"Hant",5), iVar1 != 0)) {
        if (iVar2 == 0) {
          return 0;
        }
        UVar3 = u_getPropertyValueEnum_63(UCHAR_SCRIPT,script);
        if (UVar3 == USCRIPT_INVALID_CODE) {
          return 0;
        }
        UVar4 = USCRIPT_HAN;
        if (1 < (uint)(UVar3 + ~USCRIPT_KHUTSURI)) {
          UVar4 = UVar3;
        }
        if (U_ZERO_ERROR < *err) {
          return 0;
        }
        if (capacity < 1) {
          *err = U_BUFFER_OVERFLOW_ERROR;
        }
        else {
          *scripts = UVar4;
        }
        return 1;
      }
      src = HAN_BOPO;
    }
    iVar2 = 2;
  }
  iVar2 = setCodes(src,iVar2,scripts,capacity,err);
  return iVar2;
}

Assistant:

static int32_t
getCodesFromLocale(const char *locale,
                   UScriptCode *scripts, int32_t capacity, UErrorCode *err) {
    UErrorCode internalErrorCode = U_ZERO_ERROR;
    char lang[8];
    char script[8];
    int32_t scriptLength;
    if(U_FAILURE(*err)) { return 0; }
    // Multi-script languages, equivalent to the LocaleScript data
    // that we used to load from locale resource bundles.
    /*length = */ uloc_getLanguage(locale, lang, UPRV_LENGTHOF(lang), &internalErrorCode);
    if(U_FAILURE(internalErrorCode) || internalErrorCode == U_STRING_NOT_TERMINATED_WARNING) {
        return 0;
    }
    if(0 == uprv_strcmp(lang, "ja")) {
        return setCodes(JAPANESE, UPRV_LENGTHOF(JAPANESE), scripts, capacity, err);
    }
    if(0 == uprv_strcmp(lang, "ko")) {
        return setCodes(KOREAN, UPRV_LENGTHOF(KOREAN), scripts, capacity, err);
    }
    scriptLength = uloc_getScript(locale, script, UPRV_LENGTHOF(script), &internalErrorCode);
    if(U_FAILURE(internalErrorCode) || internalErrorCode == U_STRING_NOT_TERMINATED_WARNING) {
        return 0;
    }
    if(0 == uprv_strcmp(lang, "zh") && 0 == uprv_strcmp(script, "Hant")) {
        return setCodes(HAN_BOPO, UPRV_LENGTHOF(HAN_BOPO), scripts, capacity, err);
    }
    // Explicit script code.
    if(scriptLength != 0) {
        UScriptCode scriptCode = (UScriptCode)u_getPropertyValueEnum(UCHAR_SCRIPT, script);
        if(scriptCode != USCRIPT_INVALID_CODE) {
            if(scriptCode == USCRIPT_SIMPLIFIED_HAN || scriptCode == USCRIPT_TRADITIONAL_HAN) {
                scriptCode = USCRIPT_HAN;
            }
            return setOneCode(scriptCode, scripts, capacity, err);
        }
    }
    return 0;
}